

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerMSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  int iVar1;
  SPIRVariable *pSVar2;
  SPIRType *pSVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pSVar2 = Compiler::maybe_get<spirv_cross::SPIRVariable>((Compiler *)this,id);
  pSVar3 = Compiler::expression_type((Compiler *)this,id);
  if (pSVar3->storage != StorageClassWorkgroup) {
    if (pSVar2 == (SPIRVariable *)0x0) {
      return __return_storage_ptr__;
    }
    iVar1 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,pSVar2,4);
    if ((char)iVar1 == '\0') {
      return __return_storage_ptr__;
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_qualifiers_glsl(uint32_t id)
{
	string quals;

	auto *var = maybe_get<SPIRVariable>(id);
	auto &type = expression_type(id);

	if (type.storage == StorageClassWorkgroup || (var && variable_decl_is_remapped_storage(*var, StorageClassWorkgroup)))
		quals += "threadgroup ";

	return quals;
}